

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.h
# Opt level: O2

void capnp::_::expectPrimitiveEq<capnp::Data::Reader>(Reader a,Reader b)

{
  bool bVar1;
  Reader a_local;
  Reader b_local;
  
  a_local.super_ArrayPtr<const_unsigned_char>.size_ = a.super_ArrayPtr<const_unsigned_char>.size_;
  a_local.super_ArrayPtr<const_unsigned_char>.ptr = a.super_ArrayPtr<const_unsigned_char>.ptr;
  b_local.super_ArrayPtr<const_unsigned_char>.size_ = b.super_ArrayPtr<const_unsigned_char>.size_;
  b_local.super_ArrayPtr<const_unsigned_char>.ptr = b.super_ArrayPtr<const_unsigned_char>.ptr;
  bVar1 = kj::ArrayPtr<const_unsigned_char>::operator==
                    (&a_local.super_ArrayPtr<const_unsigned_char>,
                     &b_local.super_ArrayPtr<const_unsigned_char>);
  if ((!bVar1) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[28],capnp::Data::Reader&,capnp::Data::Reader&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.h"
               ,0x9c,ERROR,"\"failed: expected \" \"(a) == (b)\", a, b",
               (char (*) [28])"failed: expected (a) == (b)",&a_local,
               (Reader *)&b_local.super_ArrayPtr<const_unsigned_char>);
  }
  return;
}

Assistant:

void expectPrimitiveEq(T a, T b) { EXPECT_EQ(a, b); }